

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImFont::BuildLookupTable(ImFont *this)

{
  ushort uVar1;
  unsigned_short uVar2;
  ImFontGlyph *pIVar3;
  float *pfVar4;
  unsigned_short *puVar5;
  ImFontGlyph *__src;
  ImFont *in_RDI;
  int i_2;
  ImFontGlyph *tab_glyph;
  int codepoint;
  int i_1;
  int i;
  int max_codepoint;
  int in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  float fVar6;
  float local_48;
  int in_stack_ffffffffffffffbc;
  undefined2 in_stack_ffffffffffffffc0;
  undefined2 in_stack_ffffffffffffffc2;
  undefined4 in_stack_ffffffffffffffc4;
  int local_24;
  int local_14;
  int local_10;
  int local_c;
  
  local_c = 0;
  for (local_10 = 0; local_10 != (in_RDI->Glyphs).Size; local_10 = local_10 + 1) {
    pIVar3 = ImVector<ImFontGlyph>::operator[](&in_RDI->Glyphs,local_10);
    local_c = ImMax<int>(local_c,(uint)pIVar3->Codepoint);
  }
  ImVector<float>::clear
            ((ImVector<float> *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  ImVector<unsigned_short>::clear
            ((ImVector<unsigned_short> *)
             CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  in_RDI->DirtyLookupTables = false;
  GrowIndex((ImFont *)
            CONCAT44(in_stack_ffffffffffffffc4,
                     CONCAT22(in_stack_ffffffffffffffc2,in_stack_ffffffffffffffc0)),
            in_stack_ffffffffffffffbc);
  for (local_14 = 0; local_14 < (in_RDI->Glyphs).Size; local_14 = local_14 + 1) {
    pIVar3 = ImVector<ImFontGlyph>::operator[](&in_RDI->Glyphs,local_14);
    uVar1 = pIVar3->Codepoint;
    pIVar3 = ImVector<ImFontGlyph>::operator[](&in_RDI->Glyphs,local_14);
    fVar6 = pIVar3->AdvanceX;
    pfVar4 = ImVector<float>::operator[](&in_RDI->IndexAdvanceX,(uint)uVar1);
    *pfVar4 = fVar6;
    puVar5 = ImVector<unsigned_short>::operator[](&in_RDI->IndexLookup,(uint)uVar1);
    *puVar5 = (unsigned_short)local_14;
  }
  pIVar3 = FindGlyph(in_RDI,0x20);
  if (pIVar3 != (ImFontGlyph *)0x0) {
    pIVar3 = ImVector<ImFontGlyph>::back(&in_RDI->Glyphs);
    if (pIVar3->Codepoint != 9) {
      ImVector<ImFontGlyph>::resize
                ((ImVector<ImFontGlyph> *)
                 CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                 in_stack_ffffffffffffffac);
    }
    pIVar3 = ImVector<ImFontGlyph>::back(&in_RDI->Glyphs);
    __src = FindGlyph(in_RDI,0x20);
    memcpy(pIVar3,__src,0x28);
    pIVar3->Codepoint = 9;
    pIVar3->AdvanceX = pIVar3->AdvanceX * 4.0;
    fVar6 = pIVar3->AdvanceX;
    pfVar4 = ImVector<float>::operator[](&in_RDI->IndexAdvanceX,(uint)pIVar3->Codepoint);
    *pfVar4 = fVar6;
    uVar2 = (short)(in_RDI->Glyphs).Size - 1;
    puVar5 = ImVector<unsigned_short>::operator[](&in_RDI->IndexLookup,(uint)pIVar3->Codepoint);
    *puVar5 = uVar2;
  }
  pIVar3 = FindGlyphNoFallback(in_RDI,in_RDI->FallbackChar);
  in_RDI->FallbackGlyph = pIVar3;
  if (in_RDI->FallbackGlyph == (ImFontGlyph *)0x0) {
    local_48 = 0.0;
  }
  else {
    local_48 = in_RDI->FallbackGlyph->AdvanceX;
  }
  in_RDI->FallbackAdvanceX = local_48;
  for (local_24 = 0; local_24 < local_c + 1; local_24 = local_24 + 1) {
    pfVar4 = ImVector<float>::operator[](&in_RDI->IndexAdvanceX,local_24);
    if (*pfVar4 <= 0.0 && *pfVar4 != 0.0) {
      fVar6 = in_RDI->FallbackAdvanceX;
      pfVar4 = ImVector<float>::operator[](&in_RDI->IndexAdvanceX,local_24);
      *pfVar4 = fVar6;
    }
  }
  return;
}

Assistant:

void ImFont::BuildLookupTable()
{
    int max_codepoint = 0;
    for (int i = 0; i != Glyphs.Size; i++)
        max_codepoint = ImMax(max_codepoint, (int)Glyphs[i].Codepoint);

    IM_ASSERT(Glyphs.Size < 0xFFFF); // -1 is reserved
    IndexAdvanceX.clear();
    IndexLookup.clear();
    DirtyLookupTables = false;
    GrowIndex(max_codepoint + 1);
    for (int i = 0; i < Glyphs.Size; i++)
    {
        int codepoint = (int)Glyphs[i].Codepoint;
        IndexAdvanceX[codepoint] = Glyphs[i].AdvanceX;
        IndexLookup[codepoint] = (ImWchar)i;
    }

    // Create a glyph to handle TAB
    // FIXME: Needs proper TAB handling but it needs to be contextualized (or we could arbitrary say that each string starts at "column 0" ?)
    if (FindGlyph((ImWchar)' '))
    {
        if (Glyphs.back().Codepoint != '\t')   // So we can call this function multiple times
            Glyphs.resize(Glyphs.Size + 1);
        ImFontGlyph& tab_glyph = Glyphs.back();
        tab_glyph = *FindGlyph((ImWchar)' ');
        tab_glyph.Codepoint = '\t';
        tab_glyph.AdvanceX *= 4;
        IndexAdvanceX[(int)tab_glyph.Codepoint] = (float)tab_glyph.AdvanceX;
        IndexLookup[(int)tab_glyph.Codepoint] = (ImWchar)(Glyphs.Size-1);
    }

    FallbackGlyph = FindGlyphNoFallback(FallbackChar);
    FallbackAdvanceX = FallbackGlyph ? FallbackGlyph->AdvanceX : 0.0f;
    for (int i = 0; i < max_codepoint + 1; i++)
        if (IndexAdvanceX[i] < 0.0f)
            IndexAdvanceX[i] = FallbackAdvanceX;
}